

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void encode_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
              int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PC_TREE *pc_tree,int *rate)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  BLOCK_SIZE BVar4;
  uint uVar5;
  int iVar6;
  ThreadData_conflict *td_00;
  TokenExtra **tp_00;
  AV1_COMP *in_RCX;
  ThreadData_conflict *in_RDX;
  undefined8 unaff_RBX;
  PICK_MODE_CONTEXT *unaff_RBP;
  AV1_COMP *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  RUN_TYPE unaff_retaddr;
  undefined7 unaff_retaddr_00;
  BLOCK_SIZE in_stack_00000008;
  BLOCK_SIZE in_stack_00000010;
  undefined7 in_stack_00000011;
  int *in_stack_00000018;
  undefined8 in_stack_00000020;
  int this_mi_col;
  int this_mi_row;
  FRAME_CONTEXT *fc;
  int has_cols;
  int has_rows;
  BLOCK_SIZE bsize2;
  int i;
  int quarter_step;
  BLOCK_SIZE subsize;
  PARTITION_TYPE partition;
  int ctx;
  int is_partition_root;
  int hbs;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  PARTITION_TYPE in_stack_ffffffffffffff35;
  BLOCK_SIZE in_stack_ffffffffffffff36;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  MACROBLOCKD *in_stack_ffffffffffffff50;
  int local_94;
  int local_70;
  AV1_COMP *pAVar7;
  int mi_row_00;
  RUN_TYPE RVar8;
  AV1_COMP *pAVar9;
  PARTITION_TYPE partition_00;
  
  td_00 = (ThreadData_conflict *)(in_RDI + 0x3bf80);
  tp_00 = (TokenExtra **)(in_RDI + 0x3c188);
  uVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [in_stack_00000010] / 2;
  pAVar7 = in_RSI;
  pAVar9 = in_RSI;
  if (in_stack_00000010 < BLOCK_8X8) {
    local_94 = -1;
  }
  else {
    local_94 = partition_plane_context
                         ((MACROBLOCKD *)((in_RSI->enc_quant_dequant_params).quants.y_quant + 0x19),
                          in_R8D,in_R9D,in_stack_00000010);
  }
  iVar3 = *in_stack_00000018;
  BVar4 = get_partition_subsize(in_stack_ffffffffffffff36,in_stack_ffffffffffffff35);
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [in_stack_00000010];
  get_partition_subsize(in_stack_ffffffffffffff36,in_stack_ffffffffffffff35);
  if (((in_R8D < *(int *)((long)tp_00 + 0xc)) && (in_R9D < *(int *)(tp_00 + 2))) &&
     (BVar4 != BLOCK_INVALID)) {
    if (((in_stack_00000008 == BLOCK_4X4) && (-1 < local_94)) &&
       (((int)(in_R8D + uVar5) < *(int *)((long)tp_00 + 0xc) &&
        (((int)(in_R9D + uVar5) < *(int *)(tp_00 + 2) &&
         ((char)(in_RDX->mb).mode_costs.y_mode_costs[4][0xc][4] != '\0')))))) {
      lVar2 = *(long *)((in_RSI->enc_quant_dequant_params).quants.y_zbin[0xb2] + 4);
      iVar6 = partition_cdf_length(in_stack_00000010);
      update_cdf((aom_cdf_prob *)(lVar2 + 0x3532 + (long)local_94 * 0x16),(int8_t)iVar3,iVar6);
    }
    partition_00 = (PARTITION_TYPE)unaff_RBX;
    BVar4 = (BLOCK_SIZE)in_RDI;
    iVar6 = (int)pAVar7;
    mi_row_00 = (int)((ulong)pAVar7 >> 0x20);
    RVar8 = (RUN_TYPE)pAVar9;
    switch((int8_t)iVar3) {
    case '\0':
      in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + 2);
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,mi_row_00,iVar6,RVar8,BVar4
               ,partition_00,unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      in_stack_ffffffffffffff48 = in_stack_00000020;
      break;
    case '\x01':
      in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + 4);
      in_stack_ffffffffffffff48 = in_stack_00000020;
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,mi_row_00,iVar6,RVar8,BVar4
               ,partition_00,unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      if ((int)(in_R8D + uVar5) < *(int *)((long)tp_00 + 0xc)) {
        in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + 6);
        encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
                 (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,(RUN_TYPE)pAVar9,BVar4,partition_00,
                 unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
        in_stack_ffffffffffffff48 = in_stack_00000020;
      }
      break;
    case '\x02':
      in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + 8);
      in_stack_ffffffffffffff48 = in_stack_00000020;
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,mi_row_00,iVar6,RVar8,BVar4
               ,partition_00,unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      if ((int)(in_R9D + uVar5) < *(int *)(tp_00 + 2)) {
        in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + 10);
        encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
                 (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,(RUN_TYPE)pAVar9,BVar4,partition_00,
                 unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
        in_stack_ffffffffffffff48 = in_stack_00000020;
      }
      break;
    case '\x03':
      encode_sb(pAVar9,in_RDX,(TileDataEnc *)in_RCX,(TokenExtra **)CONCAT44(in_R8D,in_R9D),
                (int)((ulong)td_00 >> 0x20),(int)td_00,unaff_retaddr,in_stack_00000008,
                (PC_TREE *)CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_00000018);
      encode_sb(pAVar9,in_RDX,(TileDataEnc *)in_RCX,(TokenExtra **)CONCAT44(in_R8D,in_R9D),
                (int)((ulong)td_00 >> 0x20),(int)td_00,unaff_retaddr,in_stack_00000008,
                (PC_TREE *)CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_00000018);
      encode_sb(pAVar9,in_RDX,(TileDataEnc *)in_RCX,(TokenExtra **)CONCAT44(in_R8D,in_R9D),
                (int)((ulong)td_00 >> 0x20),(int)td_00,unaff_retaddr,in_stack_00000008,
                (PC_TREE *)CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_00000018);
      encode_sb(pAVar9,in_RDX,(TileDataEnc *)in_RCX,(TokenExtra **)CONCAT44(in_R8D,in_R9D),
                (int)((ulong)td_00 >> 0x20),(int)td_00,unaff_retaddr,in_stack_00000008,
                (PC_TREE *)CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_00000018);
      in_stack_ffffffffffffff40 = in_stack_00000020;
      break;
    case '\x04':
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,mi_row_00,iVar6,RVar8,BVar4
               ,partition_00,unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      RVar8 = (RUN_TYPE)pAVar9;
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
               (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,RVar8,BVar4,partition_00,unaff_RBP,
               (int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + 0x10);
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
               (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,RVar8,BVar4,partition_00,unaff_RBP,
               (int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      in_stack_ffffffffffffff48 = in_stack_00000020;
      break;
    case '\x05':
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,mi_row_00,iVar6,RVar8,BVar4
               ,partition_00,unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      RVar8 = (RUN_TYPE)pAVar9;
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
               (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,RVar8,BVar4,partition_00,unaff_RBP,
               (int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + 0x16);
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
               (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,RVar8,BVar4,partition_00,unaff_RBP,
               (int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      in_stack_ffffffffffffff48 = in_stack_00000020;
      break;
    case '\x06':
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,mi_row_00,iVar6,RVar8,BVar4
               ,partition_00,unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      RVar8 = (RUN_TYPE)pAVar9;
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
               (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,RVar8,BVar4,partition_00,unaff_RBP,
               (int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + 0x1c);
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
               (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,RVar8,BVar4,partition_00,unaff_RBP,
               (int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      in_stack_ffffffffffffff48 = in_stack_00000020;
      break;
    case '\a':
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,mi_row_00,iVar6,RVar8,BVar4
               ,partition_00,unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      RVar8 = (RUN_TYPE)pAVar9;
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
               (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,RVar8,BVar4,partition_00,unaff_RBP,
               (int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + 0x22);
      encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
               (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,RVar8,BVar4,partition_00,unaff_RBP,
               (int *)CONCAT71(unaff_retaddr_00,unaff_retaddr));
      in_stack_ffffffffffffff48 = in_stack_00000020;
      break;
    case '\b':
      for (local_70 = 0;
          (local_70 < 4 &&
          ((local_70 < 1 || ((int)(in_R8D + local_70 * (bVar1 / 4)) < *(int *)((long)tp_00 + 0xc))))
          ); local_70 = local_70 + 1) {
        in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + (long)local_70 * 2 + 0x24);
        in_stack_ffffffffffffff48 = in_stack_00000020;
        encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
                 (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,(RUN_TYPE)pAVar9,(BLOCK_SIZE)in_RDI,
                 (PARTITION_TYPE)unaff_RBX,unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr)
                );
      }
      break;
    case '\t':
      for (local_70 = 0;
          (local_70 < 4 &&
          ((local_70 < 1 || ((int)(in_R9D + local_70 * (bVar1 / 4)) < *(int *)(tp_00 + 2)))));
          local_70 = local_70 + 1) {
        in_stack_ffffffffffffff40 = *(undefined8 *)(in_stack_00000018 + (long)local_70 * 2 + 0x2c);
        in_stack_ffffffffffffff48 = in_stack_00000020;
        encode_b(in_RCX,(TileDataEnc *)CONCAT44(in_R8D,in_R9D),td_00,tp_00,
                 (int)((ulong)pAVar7 >> 0x20),(int)pAVar7,(RUN_TYPE)pAVar9,(BLOCK_SIZE)in_RDI,
                 (PARTITION_TYPE)unaff_RBX,unaff_RBP,(int *)CONCAT71(unaff_retaddr_00,unaff_retaddr)
                );
      }
    }
    update_ext_partition_context
              (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
               (int)in_stack_ffffffffffffff48,(BLOCK_SIZE)((ulong)in_stack_ffffffffffffff40 >> 0x38)
               ,(BLOCK_SIZE)((ulong)in_stack_ffffffffffffff40 >> 0x30),
               (PARTITION_TYPE)((ulong)in_stack_ffffffffffffff40 >> 0x28));
  }
  return;
}

Assistant:

static void encode_sb(const AV1_COMP *const cpi, ThreadData *td,
                      TileDataEnc *tile_data, TokenExtra **tp, int mi_row,
                      int mi_col, RUN_TYPE dry_run, BLOCK_SIZE bsize,
                      PC_TREE *pc_tree, int *rate) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int hbs = mi_size_wide[bsize] / 2;
  const int is_partition_root = bsize >= BLOCK_8X8;
  const int ctx = is_partition_root
                      ? partition_plane_context(xd, mi_row, mi_col, bsize)
                      : -1;
  const PARTITION_TYPE partition = pc_tree->partitioning;
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
#if !CONFIG_REALTIME_ONLY
  int quarter_step = mi_size_wide[bsize] / 4;
  int i;
  BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
#endif

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;
  if (subsize == BLOCK_INVALID) return;

  if (!dry_run && ctx >= 0) {
    const int has_rows = (mi_row + hbs) < mi_params->mi_rows;
    const int has_cols = (mi_col + hbs) < mi_params->mi_cols;

    if (has_rows && has_cols) {
#if CONFIG_ENTROPY_STATS
      td->counts->partition[ctx][partition]++;
#endif

      if (tile_data->allow_update_cdf) {
        FRAME_CONTEXT *fc = xd->tile_ctx;
        update_cdf(fc->partition_cdf[ctx], partition,
                   partition_cdf_length(bsize));
      }
    }
  }

  switch (partition) {
    case PARTITION_NONE:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->none, rate);
      break;
    case PARTITION_VERT:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->vertical[0], rate);
      if (mi_col + hbs < mi_params->mi_cols) {
        encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, subsize,
                 partition, pc_tree->vertical[1], rate);
      }
      break;
    case PARTITION_HORZ:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->horizontal[0], rate);
      if (mi_row + hbs < mi_params->mi_rows) {
        encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, subsize,
                 partition, pc_tree->horizontal[1], rate);
      }
      break;
    case PARTITION_SPLIT:
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, dry_run, subsize,
                pc_tree->split[0], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col + hbs, dry_run, subsize,
                pc_tree->split[1], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row + hbs, mi_col, dry_run, subsize,
                pc_tree->split[2], rate);
      encode_sb(cpi, td, tile_data, tp, mi_row + hbs, mi_col + hbs, dry_run,
                subsize, pc_tree->split[3], rate);
      break;

#if !CONFIG_REALTIME_ONLY
    case PARTITION_HORZ_A:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, bsize2,
               partition, pc_tree->horizontala[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, bsize2,
               partition, pc_tree->horizontala[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, subsize,
               partition, pc_tree->horizontala[2], rate);
      break;
    case PARTITION_HORZ_B:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->horizontalb[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, bsize2,
               partition, pc_tree->horizontalb[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col + hbs, dry_run,
               bsize2, partition, pc_tree->horizontalb[2], rate);
      break;
    case PARTITION_VERT_A:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, bsize2,
               partition, pc_tree->verticala[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col, dry_run, bsize2,
               partition, pc_tree->verticala[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, subsize,
               partition, pc_tree->verticala[2], rate);

      break;
    case PARTITION_VERT_B:
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col, dry_run, subsize,
               partition, pc_tree->verticalb[0], rate);
      encode_b(cpi, tile_data, td, tp, mi_row, mi_col + hbs, dry_run, bsize2,
               partition, pc_tree->verticalb[1], rate);
      encode_b(cpi, tile_data, td, tp, mi_row + hbs, mi_col + hbs, dry_run,
               bsize2, partition, pc_tree->verticalb[2], rate);
      break;
    case PARTITION_HORZ_4:
      for (i = 0; i < SUB_PARTITIONS_PART4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= mi_params->mi_rows) break;

        encode_b(cpi, tile_data, td, tp, this_mi_row, mi_col, dry_run, subsize,
                 partition, pc_tree->horizontal4[i], rate);
      }
      break;
    case PARTITION_VERT_4:
      for (i = 0; i < SUB_PARTITIONS_PART4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= mi_params->mi_cols) break;
        encode_b(cpi, tile_data, td, tp, mi_row, this_mi_col, dry_run, subsize,
                 partition, pc_tree->vertical4[i], rate);
      }
      break;
#endif
    default: assert(0 && "Invalid partition type."); break;
  }

  update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}